

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int big2_scanLit(int open,ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  char *pcVar1;
  uint local_44;
  uint local_38;
  int t;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  int open_local;
  
  pcVar1 = ptr;
  do {
    end_local = pcVar1;
    if (end_local == end) {
      return -1;
    }
    if (*end_local == '\0') {
      local_38 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)end_local[1]);
    }
    else {
      local_38 = unicode_byte_type(*end_local,end_local[1]);
    }
    switch(local_38) {
    case 0:
    case 1:
    case 8:
      *nextTokPtr = end_local;
      return 0;
    default:
      pcVar1 = end_local + 2;
      break;
    case 5:
      if ((long)end - (long)end_local < 2) {
        return -2;
      }
      pcVar1 = end_local + 2;
      break;
    case 6:
      if ((long)end - (long)end_local < 3) {
        return -2;
      }
      pcVar1 = end_local + 3;
      break;
    case 7:
      if ((long)end - (long)end_local < 4) {
        return -2;
      }
      pcVar1 = end_local + 4;
      break;
    case 0xc:
    case 0xd:
      pcVar1 = end_local + 2;
      if (local_38 == open) {
        if (pcVar1 == end) {
          enc_local._4_4_ = -0x1b;
        }
        else {
          *nextTokPtr = pcVar1;
          if (*pcVar1 == '\0') {
            local_44 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)end_local[3]);
          }
          else {
            local_44 = unicode_byte_type(*pcVar1,end_local[3]);
          }
          if (((local_44 - 9 < 3) || (local_44 - 0x14 < 2)) || (local_44 == 0x1e)) {
            enc_local._4_4_ = 0x1b;
          }
          else {
            enc_local._4_4_ = 0;
          }
        }
        return enc_local._4_4_;
      }
    }
  } while( true );
}

Assistant:

static
int PREFIX(scanLit)(int open, const ENCODING *enc,
                    const char *ptr, const char *end,
                    const char **nextTokPtr)
{
  while (ptr != end) {
    int t = BYTE_TYPE(enc, ptr);
    switch (t) {
    INVALID_CASES(ptr, nextTokPtr)
    case BT_QUOT:
    case BT_APOS:
      ptr += MINBPC(enc);
      if (t != open)
        break;
      if (ptr == end)
        return -XML_TOK_LITERAL;
      *nextTokPtr = ptr;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S: case BT_CR: case BT_LF:
      case BT_GT: case BT_PERCNT: case BT_LSQB:
        return XML_TOK_LITERAL;
      default:
        return XML_TOK_INVALID;
      }
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  return XML_TOK_PARTIAL;
}